

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::boolean_go<long_double>
          (Boxed_Number *this,Opers t_oper,longdouble *t,longdouble *u)

{
  bool b;
  bad_any_cast *this_00;
  longdouble lVar1;
  longdouble lVar2;
  Boxed_Value BVar3;
  
  switch(t_oper) {
  case equals:
    b = *t == *u;
    goto LAB_001707ef;
  case less_than:
    lVar2 = *t;
    lVar1 = *u;
    break;
  case greater_than:
    lVar1 = *t;
    lVar2 = *u;
    break;
  case less_than_equal:
    lVar2 = *t;
    lVar1 = *u;
    goto LAB_001707c7;
  case greater_than_equal:
    lVar1 = *t;
    lVar2 = *u;
LAB_001707c7:
    b = lVar2 <= lVar1;
    goto LAB_001707ef;
  case not_equal:
    b = *t != *u;
    goto LAB_001707ef;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  b = lVar2 < lVar1;
LAB_001707ef:
  BVar3 = const_var((chaiscript *)this,b);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value boolean_go(Operators::Opers t_oper, const T &t, const T &u)
      {
        switch (t_oper)
        {
          case Operators::equals:
            return const_var(t == u);
          case Operators::less_than:
            return const_var(t < u);
          case Operators::greater_than:
            return const_var(t > u);
          case Operators::less_than_equal:
            return const_var(t <= u);
          case Operators::greater_than_equal:
            return const_var(t >= u);
          case Operators::not_equal:
            return const_var(t != u);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }